

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall Log::LOG(Log *this,Address *addr,char *str,...)

{
  int iVar1;
  FILE *__stream;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  undefined8 in_RCX;
  ulong uVar4;
  ulong uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE **ppFVar6;
  bool bVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string magic;
  va_list vararglist;
  undefined1 *local_118;
  uint local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (LOG(Address*,char_const*,...)::dbg_opened == '\0') {
    LOG::numwrites = 0;
    LOG::stdstring2[0] = '\0';
    strcpy(LOG::stdstring3,LOG::stdstring2);
    sVar3 = strlen(LOG::stdstring2);
    builtin_strncpy(LOG::stdstring2 + sVar3,"dbg.log",8);
    sVar3 = strlen(LOG::stdstring3);
    builtin_strncpy(LOG::stdstring3 + sVar3,"stats.lo",8);
    (LOG::stdstring3 + sVar3 + 8)[0] = 'g';
    (LOG::stdstring3 + sVar3 + 8)[1] = '\0';
    LOG::fp = (FILE *)fopen(LOG::stdstring2,"w");
    LOG::fp2 = (FILE *)fopen(LOG::stdstring3,"w");
    LOG(Address*,char_const*,...)::dbg_opened = '\x01';
  }
  else {
    sprintf(LOG::stdstring,"%d.%d.%d.%d:%d ",(ulong)(uint)(int)addr->addr[0],
            (ulong)(uint)(int)addr->addr[1],(ulong)(uint)(int)addr->addr[2],
            (ulong)(uint)(int)addr->addr[3],(int)*(short *)(addr->addr + 4));
  }
  local_e8 = local_d8;
  local_f0 = &stack0x00000008;
  local_f8 = 0x3000000018;
  vsprintf(LOG::buffer,str,&local_f8);
  if (this->firstTime == false) {
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CS425","");
    if ((int)local_110 < 1) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      uVar4 = 0;
      do {
        uVar4 = (ulong)(uint)((int)uVar4 + (int)(char)local_118[uVar5]);
        uVar5 = uVar5 + 1;
      } while ((local_110 & 0x7fffffff) != uVar5);
    }
    fprintf((FILE *)LOG::fp,"%x\n",uVar4);
    this->firstTime = true;
    if (local_118 != local_108) {
      operator_delete(local_118);
    }
  }
  ppFVar6 = &LOG::fp;
  if (LOG::buffer._8_2_ == 0x2347 && LOG::buffer._0_8_ == 0x4f4c535441545323) {
    ppFVar6 = &LOG::fp2;
  }
  fprintf((FILE *)*ppFVar6,"\n %s",LOG::stdstring);
  __stream = (FILE *)*ppFVar6;
  uVar2 = Params::getcurrtime(this->par);
  fprintf(__stream,"[%d] ",(ulong)uVar2);
  fprintf((FILE *)*ppFVar6,LOG::buffer);
  iVar1 = LOG::numwrites + 1;
  bVar7 = -1 < LOG::numwrites;
  LOG::numwrites = iVar1;
  if (bVar7) {
    fflush((FILE *)LOG::fp);
    fflush((FILE *)LOG::fp2);
    LOG::numwrites = 0;
  }
  return;
}

Assistant:

void Log::LOG(Address *addr, const char * str, ...) {

	static FILE *fp;
	static FILE *fp2;
	va_list vararglist;
	static char buffer[30000];
	static int numwrites;
	static char stdstring[30];
	static char stdstring2[40];
	static char stdstring3[40]; 
	static int dbg_opened=0;

	if(dbg_opened != 639){
		numwrites=0;

		stdstring2[0]=0;

		strcpy(stdstring3, stdstring2);

		strcat(stdstring2, DBG_LOG);
		strcat(stdstring3, STATS_LOG);

		fp = fopen(stdstring2, "w");
		fp2 = fopen(stdstring3, "w");

		dbg_opened=639;
	}
	else 

	sprintf(stdstring, "%d.%d.%d.%d:%d ", addr->addr[0], addr->addr[1], addr->addr[2], addr->addr[3], *(short *)&addr->addr[4]);

	va_start(vararglist, str);
	vsprintf(buffer, str, vararglist);
	va_end(vararglist);

	if (!firstTime) {
		int magicNumber = 0;
		string magic = MAGIC_NUMBER;
		int len = magic.length();
		for ( int i = 0; i < len; i++ ) {
			magicNumber += (int)magic.at(i);
		}
		fprintf(fp, "%x\n", magicNumber);
		firstTime = true;
	}

	if(memcmp(buffer, "#STATSLOG#", 10)==0){
		fprintf(fp2, "\n %s", stdstring);
		fprintf(fp2, "[%d] ", par->getcurrtime());

		fprintf(fp2, buffer);
	}
	else{
		fprintf(fp, "\n %s", stdstring);
		fprintf(fp, "[%d] ", par->getcurrtime());
		fprintf(fp, buffer);

	}

	if(++numwrites >= MAXWRITES){
		fflush(fp);
		fflush(fp2);
		numwrites=0;
	}

}